

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

bool __thiscall
duckdb::CSVReaderOptions::SetBaseOption
          (CSVReaderOptions *this,string *loption,Value *value,bool write_option)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  LogicalTypeId LVar1;
  pointer pVVar2;
  bool bVar3;
  FileCompressionType FVar4;
  LogicalType *pLVar5;
  vector<duckdb::Value,_true> *pvVar6;
  string *psVar7;
  BinderException *pBVar8;
  pointer value_00;
  allocator local_1b1;
  Value local_1b0;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::__cxx11::string::string((string *)&local_150,(string *)loption);
  ::std::__cxx11::string::string((string *)&local_170,"delim",(allocator *)&local_1b0);
  bVar3 = StringUtil::StartsWith(&local_150,&local_170);
  if (bVar3) {
    ::std::__cxx11::string::~string((string *)&local_170);
    ::std::__cxx11::string::~string((string *)&local_150);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_110,(string *)loption);
    ::std::__cxx11::string::string((string *)&local_130,"sep",&local_1b1);
    bVar3 = StringUtil::StartsWith(&local_110,&local_130);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::__cxx11::string::~string((string *)&local_110);
    ::std::__cxx11::string::~string((string *)&local_170);
    ::std::__cxx11::string::~string((string *)&local_150);
    if (!bVar3) {
      bVar3 = ::std::operator==(loption,"quote");
      if (bVar3) {
        ParseString((string *)&local_1b0,value,loption);
        SetQuote(this,(string *)&local_1b0);
      }
      else {
        bVar3 = ::std::operator==(loption,"comment");
        if (bVar3) {
          ParseString((string *)&local_1b0,value,loption);
          SetComment(this,(string *)&local_1b0);
        }
        else {
          bVar3 = ::std::operator==(loption,"new_line");
          if (bVar3) {
            ParseString((string *)&local_1b0,value,loption);
            SetNewline(this,(string *)&local_1b0);
          }
          else {
            bVar3 = ::std::operator==(loption,"escape");
            if (bVar3) {
              ParseString((string *)&local_1b0,value,loption);
              SetEscape(this,(string *)&local_1b0);
            }
            else {
              bVar3 = ::std::operator==(loption,"header");
              if (bVar3) {
                bVar3 = ParseBoolean(value,loption);
                if ((this->dialect_options).header.set_by_user != false) {
                  return true;
                }
                (this->dialect_options).header.value = bVar3;
                (this->dialect_options).header.set_by_user = true;
                return true;
              }
              bVar3 = ::std::operator==(loption,"nullstr");
              if ((bVar3) || (bVar3 = ::std::operator==(loption,"null"), bVar3)) {
                this_00 = &this->null_str;
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear(&this_00->
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       );
                LVar1 = (value->type_).id_;
                if (LVar1 == VARCHAR) {
                  if ((this->null_str).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (this->null_str).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_018d174f;
                  ParseString(&local_d0,value,loption);
                  Value::Value(&local_1b0,&local_d0);
                  psVar7 = StringValue::Get_abi_cxx11_(&local_1b0);
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)this_00,psVar7);
                  Value::~Value(&local_1b0);
                  ::std::__cxx11::string::~string((string *)&local_d0);
                }
                else {
                  if (LVar1 != LIST) {
                    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
                    ::std::__cxx11::string::string
                              ((string *)&local_1b0,
                               "CSV Reader function option %s requires a string or a list as input",
                               &local_1b1);
                    ::std::__cxx11::string::string((string *)&local_50,(string *)loption);
                    BinderException::BinderException<std::__cxx11::string>
                              (pBVar8,(string *)&local_1b0,&local_50);
                    __cxa_throw(pBVar8,&BinderException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  if ((this->null_str).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (this->null_str).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_018d174f:
                    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
                    ::std::__cxx11::string::string
                              ((string *)&local_1b0,
                               "CSV Reader function option nullstr can only be supplied once",
                               &local_1b1);
                    BinderException::BinderException(pBVar8,(string *)&local_1b0);
                    __cxa_throw(pBVar8,&BinderException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  pLVar5 = ListType::GetChildType(&value->type_);
                  if (pLVar5->id_ != VARCHAR) {
                    if (pLVar5->id_ != LIST) {
                      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
                      ::std::__cxx11::string::string
                                ((string *)&local_1b0,
                                 "CSV Reader function option %s requires a non-empty list of possible null strings (varchar) as input"
                                 ,&local_1b1);
                      ::std::__cxx11::string::string((string *)&local_90,(string *)loption);
                      BinderException::BinderException<std::__cxx11::string>
                                (pBVar8,(string *)&local_1b0,&local_90);
                      __cxa_throw(pBVar8,&BinderException::typeinfo,
                                  ::std::runtime_error::~runtime_error);
                    }
                    pLVar5 = ListType::GetChildType(pLVar5);
                    pvVar6 = ListValue::GetChildren(value);
                    if ((pLVar5->id_ != VARCHAR) ||
                       ((long)(pvVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                              _M_impl.super__Vector_impl_data._M_start != 0x40)) {
                      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
                      ::std::__cxx11::string::string
                                ((string *)&local_1b0,
                                 "CSV Reader function option %s requires a non-empty list of possible null strings (varchar) as input"
                                 ,&local_1b1);
                      ::std::__cxx11::string::string((string *)&local_70,(string *)loption);
                      BinderException::BinderException<std::__cxx11::string>
                                (pBVar8,(string *)&local_1b0,&local_70);
                      __cxa_throw(pBVar8,&BinderException::typeinfo,
                                  ::std::runtime_error::~runtime_error);
                    }
                    value = vector<duckdb::Value,_true>::back(pvVar6);
                  }
                  pvVar6 = ListValue::GetChildren(value);
                  pVVar2 = (pvVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                  for (value_00 = (pvVar6->
                                  super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  _M_impl.super__Vector_impl_data._M_start; value_00 != pVVar2;
                      value_00 = value_00 + 1) {
                    if (value_00->is_null == true) {
                      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
                      ::std::__cxx11::string::string
                                ((string *)&local_1b0,
                                 "CSV Reader function option %s does not accept NULL values as a valid nullstr option"
                                 ,&local_1b1);
                      ::std::__cxx11::string::string((string *)&local_b0,(string *)loption);
                      BinderException::BinderException<std::__cxx11::string>
                                (pBVar8,(string *)&local_1b0,&local_b0);
                      __cxa_throw(pBVar8,&BinderException::typeinfo,
                                  ::std::runtime_error::~runtime_error);
                    }
                    psVar7 = StringValue::Get_abi_cxx11_(value_00);
                    ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)this_00,psVar7);
                  }
                }
                if (!write_option ||
                    (ulong)((long)(this->null_str).
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
                  return true;
                }
                pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&local_1b0,
                           "CSV Writer function option %s only accepts one nullstr value.",
                           &local_1b1);
                ::std::__cxx11::string::string((string *)&local_f0,(string *)loption);
                BinderException::BinderException<std::__cxx11::string>
                          (pBVar8,(string *)&local_1b0,&local_f0);
                __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
              }
              bVar3 = ::std::operator==(loption,"compression");
              if (!bVar3) {
                bVar3 = ::std::operator==(loption,"strict_mode");
                if (!bVar3) {
                  return false;
                }
                bVar3 = ParseBoolean(value,loption);
                if ((this->dialect_options).state_machine_options.strict_mode.set_by_user != false)
                {
                  return true;
                }
                (this->dialect_options).state_machine_options.strict_mode.value = bVar3;
                (this->dialect_options).state_machine_options.strict_mode.set_by_user = true;
                return true;
              }
              ParseString((string *)&local_1b0,value,loption);
              FVar4 = FileCompressionTypeFromString((string *)&local_1b0);
              this->compression = FVar4;
            }
          }
        }
      }
      goto LAB_018d1359;
    }
  }
  ParseString((string *)&local_1b0,value,loption);
  SetDelimiter(this,(string *)&local_1b0);
LAB_018d1359:
  ::std::__cxx11::string::~string((string *)&local_1b0);
  return true;
}

Assistant:

bool CSVReaderOptions::SetBaseOption(const string &loption, const Value &value, bool write_option) {
	// Make sure this function was only called after the option was turned into lowercase
	D_ASSERT(!std::any_of(loption.begin(), loption.end(), ::isupper));

	if (StringUtil::StartsWith(loption, "delim") || StringUtil::StartsWith(loption, "sep")) {
		SetDelimiter(ParseString(value, loption));
	} else if (loption == "quote") {
		SetQuote(ParseString(value, loption));
	} else if (loption == "comment") {
		SetComment(ParseString(value, loption));
	} else if (loption == "new_line") {
		SetNewline(ParseString(value, loption));
	} else if (loption == "escape") {
		SetEscape(ParseString(value, loption));
	} else if (loption == "header") {
		SetHeader(ParseBoolean(value, loption));
	} else if (loption == "nullstr" || loption == "null") {
		auto &child_type = value.type();
		null_str.clear();
		if (child_type.id() != LogicalTypeId::LIST && child_type.id() != LogicalTypeId::VARCHAR) {
			throw BinderException("CSV Reader function option %s requires a string or a list as input", loption);
		}
		if (!null_str.empty()) {
			throw BinderException("CSV Reader function option nullstr can only be supplied once");
		}
		if (child_type.id() == LogicalTypeId::LIST) {
			auto &list_child = ListType::GetChildType(child_type);
			const vector<Value> *children = nullptr;
			if (list_child.id() == LogicalTypeId::LIST) {
				// This can happen if it comes from a copy FROM/TO
				auto &list_grandchild = ListType::GetChildType(list_child);
				auto &children_ref = ListValue::GetChildren(value);
				if (list_grandchild.id() != LogicalTypeId::VARCHAR || children_ref.size() != 1) {
					throw BinderException("CSV Reader function option %s requires a non-empty list of possible null "
					                      "strings (varchar) as input",
					                      loption);
				}
				children = &ListValue::GetChildren(children_ref.back());
			} else if (list_child.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("CSV Reader function option %s requires a non-empty list of possible null "
				                      "strings (varchar) as input",
				                      loption);
			}
			if (!children) {
				children = &ListValue::GetChildren(value);
			}
			for (auto &child : *children) {
				if (child.IsNull()) {
					throw BinderException(
					    "CSV Reader function option %s does not accept NULL values as a valid nullstr option", loption);
				}
				null_str.push_back(StringValue::Get(child));
			}
		} else {
			null_str.push_back(StringValue::Get(ParseString(value, loption)));
		}
		if (null_str.size() > 1 && write_option) {
			throw BinderException("CSV Writer function option %s only accepts one nullstr value.", loption);
		}

	} else if (loption == "compression") {
		SetCompression(ParseString(value, loption));
	} else if (loption == "strict_mode") {
		SetRFC4180(ParseBoolean(value, loption));
	} else {
		// unrecognized option in base CSV
		return false;
	}
	return true;
}